

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::LogToClipboard(int max_depth)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  if (GImGui->LogEnabled == false) {
    pIVar1 = GImGui->CurrentWindow;
    GImGui->LogFile = (FILE *)0x0;
    pIVar2->LogEnabled = true;
    pIVar2->LogStartDepth = (pIVar1->DC).TreeDepth;
    if (-1 < max_depth) {
      pIVar2->LogAutoExpandMaxDepth = max_depth;
    }
  }
  return;
}

Assistant:

void ImGui::LogToClipboard(int max_depth)
{
    ImGuiContext& g = *GImGui;
    if (g.LogEnabled)
        return;
    ImGuiWindow* window = g.CurrentWindow;

    IM_ASSERT(g.LogFile == NULL);
    g.LogFile = NULL;
    g.LogEnabled = true;
    g.LogStartDepth = window->DC.TreeDepth;
    if (max_depth >= 0)
        g.LogAutoExpandMaxDepth = max_depth;
}